

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t * Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int nFrames)

{
  ushort *puVar1;
  Wlc_Obj_t *pWVar2;
  ushort uVar3;
  int iVar4;
  Wlc_Obj_t *pWVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Wlc_Obj_t *pWVar10;
  long lVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  ulong uVar13;
  long lVar14;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  if (1 < p->iObj) {
    lVar7 = 1;
    lVar9 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar7) goto LAB_00360882;
      puVar1 = (ushort *)(&p->pObjs->field_0x0 + lVar9);
      *puVar1 = *puVar1 & 0xfeff;
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar7 < p->iObj);
  }
  if (0 < vMemObjsClean->nSize) {
    lVar7 = 0;
    do {
      lVar9 = (long)vMemObjsClean->pArray[lVar7];
      if ((lVar9 < 1) || (p->nObjsAlloc <= vMemObjsClean->pArray[lVar7])) goto LAB_00360882;
      pWVar5 = p->pObjs;
      if (((undefined1  [24])((undefined1  [24])pWVar5[lVar9] & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x36) && (0 < vMemObjsClean->nSize)) {
        lVar14 = 0;
        do {
          lVar8 = (long)vMemObjsClean->pArray[lVar14];
          if ((lVar8 < 1) || (p->nObjsAlloc <= vMemObjsClean->pArray[lVar14])) goto LAB_00360882;
          uVar3 = *(ushort *)(p->pObjs + lVar8);
          if ((uVar3 & 0x3d) == 1) {
            pWVar2 = p->pObjs + lVar8;
            *(ushort *)pWVar2 = uVar3 | 0x100;
            if (0 < vMemObjsClean->nSize) {
              lVar8 = 0;
              do {
                iVar4 = vMemObjsClean->pArray[lVar8];
                if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00360882;
                pWVar10 = p->pObjs + iVar4;
                if (pWVar10 != pWVar2) {
                  if ((pWVar10->field_0x1 & 1) != 0) {
                    __assert_fail("pObj->Mark2 == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                                  ,0x4d9,
                                  "Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)"
                                 );
                  }
                  uVar13 = (ulong)pWVar10->nFanins;
                  if (0 < (int)pWVar10->nFanins) {
                    lVar11 = 0;
                    do {
                      if ((2 < (uint)uVar13) ||
                         (paVar12 = &pWVar10->field_10,
                         (undefined1  [24])((undefined1  [24])*pWVar10 & (undefined1  [24])0x2f) ==
                         (undefined1  [24])0x6)) {
                        paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)
                                  (pWVar10->field_10).pFanins[0];
                      }
                      iVar4 = paVar12->Fanins[lVar11];
                      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00360882;
                      *(ushort *)pWVar10 =
                           *(ushort *)pWVar10 | *(ushort *)(p->pObjs + iVar4) & 0x100;
                      lVar11 = lVar11 + 1;
                      uVar13 = (ulong)(int)pWVar10->nFanins;
                    } while (lVar11 < (long)uVar13);
                  }
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < vMemObjsClean->nSize);
            }
            if ((pWVar5[lVar9].field_0x1 & 1) != 0) {
              pWVar10 = p->pObjs;
              Vec_IntPush(p_00,(int)((ulong)((long)pWVar5 + (lVar9 * 0x18 - (long)pWVar10)) >> 3) *
                               -0x55555555);
              Vec_IntPush(p_00,(int)((ulong)((long)pWVar2 - (long)pWVar10) >> 3) * -0x55555555);
              Vec_IntPush(p_00,-1);
            }
            if (0 < vMemObjsClean->nSize) {
              lVar8 = 0;
              do {
                iVar4 = vMemObjsClean->pArray[lVar8];
                if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_00360882;
                *(ushort *)(p->pObjs + iVar4) = *(ushort *)(p->pObjs + iVar4) & 0xfeff;
                lVar8 = lVar8 + 1;
              } while (lVar8 < vMemObjsClean->nSize);
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < vMemObjsClean->nSize);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vMemObjsClean->nSize);
  }
  if (1 < (long)p->iObj) {
    uVar13 = 1;
    if (1 < p->nObjsAlloc) {
      uVar13 = (ulong)(uint)p->nObjsAlloc;
    }
    lVar7 = 0x18;
    do {
      if (uVar13 * 0x18 == lVar7) {
LAB_00360882:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (((&p->pObjs->field_0x1)[lVar7] & 1) != 0) {
        __assert_fail("pObj->Mark2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x4e4,"Vec_Int_t *Wlc_NtkFindReachablePiFo(Wlc_Ntk_t *, Vec_Int_t *, int)");
      }
      lVar7 = lVar7 + 0x18;
    } while ((long)p->iObj * 0x18 != lVar7);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkFindReachablePiFo( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int nFrames )
{
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pObjR, * pObjI, * pObj; 
    int i, j, k, f, fFanin;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark2 = 0;
    // go through read ports
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjR, i ) if ( Wlc_ObjIsRead(pObjR) )
    {
        // go through memory CIs
        Wlc_NtkForEachObjVec( vMemObjsClean, p, pObjI, j ) if ( Wlc_ObjIsCi(pObjI) )
        {
            // propagate bit from CI to READ
            pObjI->Mark2 = 1;
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
            {
                if ( pObj == pObjI )
                    continue;
                assert( pObj->Mark2 == 0 );
                Wlc_ObjForEachFanin( pObj, fFanin, f )
                    pObj->Mark2 |= Wlc_NtkObj(p, fFanin)->Mark2;
            }
            if ( pObjR->Mark2 )
                Vec_IntPushThree( vRes, Wlc_ObjId(p, pObjR), Wlc_ObjId(p, pObjI), -1 );
            Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, k )
                pObj->Mark2 = 0;
        }
    }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark2 == 0 );
    return vRes;
}